

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::readObject(Reader *this,Token *tokenStart)

{
  bool bVar1;
  Value *this_00;
  ulong uVar2;
  long in_RSI;
  long in_RDI;
  Value *in_stack_00000018;
  bool finalizeTokenOk;
  Token comma;
  bool ok;
  Value *value;
  Token colon;
  Value numberName;
  bool initialTokenOk;
  Value init;
  string name;
  Token tokenName;
  undefined4 in_stack_fffffffffffffdf8;
  TokenType in_stack_fffffffffffffdfc;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  Value *in_stack_fffffffffffffe08;
  string *message;
  undefined5 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe15;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  undefined8 in_stack_fffffffffffffe18;
  allocator *paVar3;
  undefined5 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe25;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  Value *in_stack_fffffffffffffe30;
  bool local_1b2;
  undefined1 local_191 [39];
  bool local_16a;
  allocator local_169;
  string local_168 [32];
  int local_148;
  string *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  byte in_stack_fffffffffffffed7;
  Reader *in_stack_fffffffffffffed8;
  Reader *in_stack_fffffffffffffee0;
  Reader *in_stack_fffffffffffffee8;
  string local_110 [32];
  int local_f0;
  string local_d8 [76];
  uint local_8c;
  bool local_85;
  Reader *in_stack_ffffffffffffff98;
  string local_50 [32];
  int local_30;
  long local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::__cxx11::string::string(local_50);
  Value::Value((Value *)CONCAT17(in_stack_fffffffffffffe17,
                                 CONCAT16(in_stack_fffffffffffffe16,
                                          CONCAT15(in_stack_fffffffffffffe15,
                                                   in_stack_fffffffffffffe10))),
               (ValueType)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  currentValue((Reader *)0x14421f);
  Value::swapPayload((Value *)CONCAT17(in_stack_fffffffffffffe17,
                                       CONCAT16(in_stack_fffffffffffffe16,
                                                CONCAT15(in_stack_fffffffffffffe15,
                                                         in_stack_fffffffffffffe10))),
                     in_stack_fffffffffffffe08);
  this_00 = currentValue((Reader *)0x144244);
  Value::setOffsetStart(this_00,*(long *)(local_18 + 8) - *(long *)(in_RDI + 0xc0));
  while (bVar1 = readToken((Reader *)
                           CONCAT17(in_stack_fffffffffffffe17,
                                    CONCAT16(in_stack_fffffffffffffe16,
                                             CONCAT15(in_stack_fffffffffffffe15,
                                                      in_stack_fffffffffffffe10))),
                           (Token *)in_stack_fffffffffffffe08), bVar1) {
    local_85 = true;
    while( true ) {
      local_1b2 = false;
      if (local_30 == 0xc) {
        local_1b2 = local_85;
      }
      if (local_1b2 == false) break;
      local_85 = readToken((Reader *)
                           CONCAT17(in_stack_fffffffffffffe17,
                                    CONCAT16(in_stack_fffffffffffffe16,
                                             CONCAT15(in_stack_fffffffffffffe15,
                                                      in_stack_fffffffffffffe10))),
                           (Token *)in_stack_fffffffffffffe08);
    }
    if (local_85 == false) break;
    if ((local_30 == 2) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
      local_1 = 1;
      local_8c = 1;
      goto LAB_00144911;
    }
    std::__cxx11::string::operator=(local_50,"");
    if (local_30 == 5) {
      bVar1 = decodeString(in_stack_fffffffffffffed8,
                           (Token *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                           in_stack_fffffffffffffec8);
      if (!bVar1) {
        local_1 = recoverFromError((Reader *)
                                   CONCAT17(in_stack_fffffffffffffe27,
                                            CONCAT16(in_stack_fffffffffffffe26,
                                                     CONCAT15(in_stack_fffffffffffffe25,
                                                              in_stack_fffffffffffffe20))),
                                   (TokenType)((ulong)in_stack_fffffffffffffe18 >> 0x20));
        local_8c = 1;
        goto LAB_00144911;
      }
    }
    else {
      if ((local_30 != 6) || ((*(byte *)(in_RDI + 0x10b) & 1) == 0)) break;
      Value::Value((Value *)CONCAT17(in_stack_fffffffffffffe17,
                                     CONCAT16(in_stack_fffffffffffffe16,
                                              CONCAT15(in_stack_fffffffffffffe15,
                                                       in_stack_fffffffffffffe10))),
                   (ValueType)((ulong)in_stack_fffffffffffffe08 >> 0x20));
      bVar1 = decodeNumber(in_stack_fffffffffffffee8,(Token *)in_stack_fffffffffffffee0,
                           (Value *)in_stack_fffffffffffffed8);
      if (bVar1) {
        Value::asString_abi_cxx11_(in_stack_00000018);
        std::__cxx11::string::operator=(local_50,local_d8);
        std::__cxx11::string::~string(local_d8);
      }
      else {
        local_1 = recoverFromError((Reader *)
                                   CONCAT17(in_stack_fffffffffffffe27,
                                            CONCAT16(in_stack_fffffffffffffe26,
                                                     CONCAT15(in_stack_fffffffffffffe25,
                                                              in_stack_fffffffffffffe20))),
                                   (TokenType)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      }
      local_8c = (uint)!bVar1;
      Value::~Value(in_stack_fffffffffffffe30);
      if (local_8c != 0) goto LAB_00144911;
    }
    bVar1 = readToken((Reader *)
                      CONCAT17(in_stack_fffffffffffffe17,
                               CONCAT16(in_stack_fffffffffffffe16,
                                        CONCAT15(in_stack_fffffffffffffe15,in_stack_fffffffffffffe10
                                                ))),(Token *)in_stack_fffffffffffffe08);
    if ((!bVar1) || (local_f0 != 0xb)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_110,"Missing \':\' after object member name",
                 (allocator *)&stack0xfffffffffffffeef);
      local_1 = addErrorAndRecover((Reader *)
                                   CONCAT17(in_stack_fffffffffffffe17,
                                            CONCAT16(in_stack_fffffffffffffe16,
                                                     CONCAT15(in_stack_fffffffffffffe15,
                                                              in_stack_fffffffffffffe10))),
                                   (string *)in_stack_fffffffffffffe08,
                                   (Token *)CONCAT17(in_stack_fffffffffffffe07,
                                                     in_stack_fffffffffffffe00),
                                   in_stack_fffffffffffffdfc);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeef);
      local_8c = 1;
      goto LAB_00144911;
    }
    in_stack_fffffffffffffe30 = currentValue((Reader *)0x14460b);
    in_stack_fffffffffffffed8 =
         (Reader *)
         Value::operator[]((Value *)CONCAT17(in_stack_fffffffffffffe17,
                                             CONCAT16(in_stack_fffffffffffffe16,
                                                      CONCAT15(in_stack_fffffffffffffe15,
                                                               in_stack_fffffffffffffe10))),
                           (string *)in_stack_fffffffffffffe08);
    in_stack_fffffffffffffee0 = in_stack_fffffffffffffed8;
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
              ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *)
               CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               (value_type *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    in_stack_fffffffffffffe27 = readValue(in_stack_ffffffffffffff98);
    in_stack_fffffffffffffed7 = in_stack_fffffffffffffe27;
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *)
               0x144683);
    if ((in_stack_fffffffffffffed7 & 1) == 0) {
      local_1 = recoverFromError((Reader *)
                                 CONCAT17(in_stack_fffffffffffffe27,
                                          CONCAT16(in_stack_fffffffffffffe26,
                                                   CONCAT15(in_stack_fffffffffffffe25,
                                                            in_stack_fffffffffffffe20))),
                                 (TokenType)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      local_8c = 1;
      goto LAB_00144911;
    }
    in_stack_fffffffffffffe25 =
         readToken((Reader *)
                   CONCAT17(in_stack_fffffffffffffe17,
                            CONCAT16(in_stack_fffffffffffffe16,
                                     CONCAT15(in_stack_fffffffffffffe15,in_stack_fffffffffffffe10)))
                   ,(Token *)in_stack_fffffffffffffe08);
    if ((!(bool)in_stack_fffffffffffffe25) ||
       (((local_148 != 2 && (local_148 != 10)) && (local_148 != 0xc)))) {
      paVar3 = &local_169;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,"Missing \',\' or \'}\' in object declaration",paVar3);
      local_1 = addErrorAndRecover((Reader *)
                                   CONCAT17(in_stack_fffffffffffffe17,
                                            CONCAT16(in_stack_fffffffffffffe16,
                                                     CONCAT15(in_stack_fffffffffffffe15,
                                                              in_stack_fffffffffffffe10))),
                                   (string *)in_stack_fffffffffffffe08,
                                   (Token *)CONCAT17(in_stack_fffffffffffffe07,
                                                     in_stack_fffffffffffffe00),
                                   in_stack_fffffffffffffdfc);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      local_8c = 1;
      goto LAB_00144911;
    }
    local_16a = true;
    while( true ) {
      bVar1 = false;
      if (local_148 == 0xc) {
        bVar1 = local_16a;
      }
      if (bVar1 == false) break;
      in_stack_fffffffffffffe15 =
           readToken((Reader *)
                     CONCAT17(in_stack_fffffffffffffe17,
                              CONCAT16(bVar1,CONCAT15(in_stack_fffffffffffffe15,
                                                      in_stack_fffffffffffffe10))),
                     (Token *)in_stack_fffffffffffffe08);
      local_16a = (bool)in_stack_fffffffffffffe15;
    }
    if (local_148 == 2) {
      local_1 = 1;
      local_8c = 1;
      goto LAB_00144911;
    }
    in_stack_fffffffffffffe16 = 0;
  }
  message = (string *)local_191;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_191 + 1),"Missing \'}\' or object member name",(allocator *)message);
  local_1 = addErrorAndRecover((Reader *)
                               CONCAT17(in_stack_fffffffffffffe17,
                                        CONCAT16(in_stack_fffffffffffffe16,
                                                 CONCAT15(in_stack_fffffffffffffe15,
                                                          in_stack_fffffffffffffe10))),message,
                               (Token *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00
                                                ),in_stack_fffffffffffffdfc);
  std::__cxx11::string::~string((string *)(local_191 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_191);
  local_8c = 1;
LAB_00144911:
  Value::~Value(in_stack_fffffffffffffe30);
  std::__cxx11::string::~string(local_50);
  return (bool)(local_1 & 1);
}

Assistant:

bool Reader::readObject(Token& tokenStart) {
  Token tokenName;
  std::string name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name = "";
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover(
          "Missing ':' after object member name", colon, tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover(
          "Missing ',' or '}' in object declaration", comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover(
      "Missing '}' or object member name", tokenName, tokenObjectEnd);
}